

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeadNode.h
# Opt level: O0

void __thiscall
duckdb_skiplistlib::skip_list::
HeadNode<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
::at(HeadNode<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
     *this,size_t index,size_t count,
    vector<std::pair<unsigned_long,_duckdb::hugeint_t>,_std::allocator<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
    *dest)

{
  Node<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
  *this_00;
  vector<std::pair<unsigned_long,_duckdb::hugeint_t>,_std::allocator<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
  *in_RCX;
  long in_RDX;
  size_t in_RSI;
  HeadNode<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
  *in_RDI;
  Node<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
  *pNode;
  undefined8 local_18;
  
  std::
  vector<std::pair<unsigned_long,_duckdb::hugeint_t>,_std::allocator<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
  ::clear((vector<std::pair<unsigned_long,_duckdb::hugeint_t>,_std::allocator<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
           *)0xa2b8cc);
  this_00 = _nodeAt(in_RDI,in_RSI);
  for (local_18 = in_RDX; local_18 != 0; local_18 = local_18 + -1) {
    if (this_00 ==
        (Node<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
         *)0x0) {
      _throw_exceeds_size((size_t)pNode);
    }
    Node<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
    ::value(this_00);
    std::
    vector<std::pair<unsigned_long,_duckdb::hugeint_t>,_std::allocator<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
    ::push_back(in_RCX,&this_00->_value);
    this_00 = Node<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
              ::next((Node<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
                      *)0xa2b927);
  }
  return;
}

Assistant:

void HeadNode<T, _Compare>::at(size_t index, size_t count,
                               std::vector<T> &dest) const {
#ifdef SKIPLIST_THREAD_SUPPORT
    std::lock_guard<std::mutex> lock(gSkipListMutex);
#endif
    dest.clear();
    const Node<T, _Compare> *pNode = _nodeAt(index);
    // _nodeAt will (should) throw an IndexError so this
    // assert should always be true
    assert(pNode);
    while (count) {
        if (! pNode) {
            _throw_exceeds_size(_count);
        }
        dest.push_back(pNode->value());
        pNode = pNode->next();
        --count;
    }
}